

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__zexpand(stbi__zbuf *z,char *zout,int n)

{
  uint uVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  uint uVar5;
  long *in_FS_OFFSET;
  
  z->zout = zout;
  if (z->z_expandable == 0) {
    lVar3 = *in_FS_OFFSET;
    pcVar4 = "output buffer limit";
  }
  else {
    pcVar4 = z->zout_start;
    uVar5 = (uint)((long)zout - (long)pcVar4);
    if (!CARRY4(n,uVar5)) {
      for (uVar1 = *(int *)&z->zout_end - (int)pcVar4; uVar1 < n + uVar5; uVar1 = uVar1 * 2) {
        if ((int)uVar1 < 0) goto LAB_00147062;
      }
      pcVar2 = (char *)realloc(pcVar4,(ulong)uVar1);
      if (pcVar2 != (char *)0x0) {
        z->zout_start = pcVar2;
        z->zout = pcVar2 + ((long)zout - (long)pcVar4 & 0xffffffff);
        z->zout_end = pcVar2 + uVar1;
        return 1;
      }
    }
LAB_00147062:
    lVar3 = *in_FS_OFFSET;
    pcVar4 = "outofmem";
  }
  *(char **)(lVar3 + -0x20) = pcVar4;
  return 0;
}

Assistant:

static int stbi__zexpand(stbi__zbuf *z, char *zout, int n)  // need to make room for n bytes
{
   char *q;
   unsigned int cur, limit, old_limit;
   z->zout = zout;
   if (!z->z_expandable) return stbi__err("output buffer limit","Corrupt PNG");
   cur   = (unsigned int) (z->zout - z->zout_start);
   limit = old_limit = (unsigned) (z->zout_end - z->zout_start);
   if (UINT_MAX - cur < (unsigned) n) return stbi__err("outofmem", "Out of memory");
   while (cur + n > limit) {
      if(limit > UINT_MAX / 2) return stbi__err("outofmem", "Out of memory");
      limit *= 2;
   }
   q = (char *) STBI_REALLOC_SIZED(z->zout_start, old_limit, limit);
   STBI_NOTUSED(old_limit);
   if (q == NULL) return stbi__err("outofmem", "Out of memory");
   z->zout_start = q;
   z->zout       = q + cur;
   z->zout_end   = q + limit;
   return 1;
}